

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<char16_t>::relocate
          (QArrayDataPointer<char16_t> *this,qsizetype offset,char16_t **data)

{
  bool bVar1;
  char16_t *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  char16_t *res;
  
  first = (char16_t *)(*(long *)(in_RDI + 8) + in_RSI * 2);
  QtPrivate::q_relocate_overlap_n<char16_t,long_long>(first,in_RDI,(char16_t *)0x5379f6);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<char16_t>,char16_t_const*>
                        (data,(QArrayDataPointer<char16_t> *)res), bVar1)) {
    *in_RDX = in_RSI * 2 + *in_RDX;
  }
  *(char16_t **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }